

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O1

int SUNLinSolSolve_SPBCGS(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype delta)

{
  uint uVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  N_Vector p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  N_Vector p_Var8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  code *pcVar14;
  code *pcVar15;
  bool bVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined8 extraout_XMM0_Qb;
  undefined4 uVar25;
  undefined4 uVar26;
  double dVar27;
  undefined1 auVar28 [16];
  N_Vector Xv [3];
  uint local_108;
  double local_c8;
  N_Vector local_b8;
  N_Vector local_b0;
  undefined8 local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  double local_78;
  double local_68;
  undefined8 uStack_60;
  ulong local_50;
  undefined1 local_48 [16];
  
  piVar2 = (int *)S->content;
  iVar20 = *piVar2;
  uVar1 = piVar2[1];
  uVar3 = *(undefined8 *)(piVar2 + 0x18);
  uVar4 = *(undefined8 *)(piVar2 + 0x16);
  p_Var5 = *(N_Vector *)(piVar2 + 0x1a);
  uVar6 = *(undefined8 *)(piVar2 + 0x1c);
  uVar7 = *(undefined8 *)(piVar2 + 0x1e);
  p_Var8 = *(N_Vector *)(piVar2 + 0x20);
  uVar9 = *(undefined8 *)(piVar2 + 0x22);
  lVar10 = *(long *)(piVar2 + 0x12);
  lVar11 = *(long *)(piVar2 + 0x14);
  uVar12 = *(undefined8 *)(piVar2 + 10);
  uVar13 = *(undefined8 *)(piVar2 + 0x10);
  pcVar14 = *(code **)(piVar2 + 8);
  pcVar15 = *(code **)(piVar2 + 0xe);
  piVar2[3] = 0;
  uVar17 = uVar1 & 0xfffffffe;
  if ((uVar17 == 2) && (piVar2[2] == 0)) {
    piVar2[2] = 0;
    piVar2[6] = -0x270e;
    return -0x270e;
  }
  if (piVar2[2] == 0) {
    iVar18 = (*pcVar14)(uVar12,x,uVar3);
    bVar21 = iVar18 < 0;
    if (iVar18 == 0) {
      N_VLinearSum(0x3ff0000000000000,b,uVar3,uVar3);
      goto LAB_0011cb34;
    }
LAB_0011cb9c:
    piVar2[2] = 0;
    iVar18 = -0x325;
    iVar20 = 0x323;
  }
  else {
    N_VScale(0x3ff0000000000000,b,uVar3);
LAB_0011cb34:
    local_108 = uVar1 | 2;
    if ((uVar1 | 2) == 3) {
      iVar18 = (*pcVar15)(delta,uVar13,uVar3,uVar4);
      bVar21 = iVar18 < 0;
      if (iVar18 == 0) goto LAB_0011cbcb;
    }
    else {
      N_VScale(0x3ff0000000000000,uVar3,uVar4);
LAB_0011cbcb:
      if (lVar10 == 0) {
        N_VScale(0x3ff0000000000000,uVar4,uVar3);
      }
      else {
        N_VProd(lVar10,uVar4,uVar3);
      }
      dVar22 = (double)N_VDotProd(uVar3,uVar3);
      dVar23 = 0.0;
      if (0.0 < dVar22) {
        if (dVar22 < 0.0) {
          dVar23 = sqrt(dVar22);
        }
        else {
          dVar23 = SQRT(dVar22);
        }
      }
      *(double *)(piVar2 + 4) = dVar23;
      if (dVar23 <= delta) {
        piVar2[2] = 0;
        iVar20 = 0;
        goto LAB_0011d19c;
      }
      N_VScale(0x3ff0000000000000,uVar3,uVar4);
      N_VScale(0x3ff0000000000000,uVar3,p_Var5);
      if ((lVar11 != 0) && (piVar2[2] == 0)) {
        N_VProd(lVar11,x);
      }
      bVar16 = 0 < iVar20;
      uVar25 = SUB84(dVar22,0);
      uVar26 = (undefined4)((ulong)dVar22 >> 0x20);
      local_c8 = dVar23;
      if (0 < iVar20) {
        local_50 = (ulong)(uint)-iVar20;
        iVar18 = 1;
        do {
          piVar2[3] = piVar2[3] + 1;
          if (lVar11 == 0) {
            N_VScale(0x3ff0000000000000,p_Var5,uVar9);
          }
          else {
            N_VDiv(p_Var5,lVar11,uVar9);
          }
          if (uVar17 == 2) {
            N_VScale(0x3ff0000000000000,uVar9,p_Var8);
            iVar19 = (*pcVar15)(delta,uVar13,p_Var8,uVar9);
            bVar21 = iVar19 < 0;
            if (iVar19 != 0) goto LAB_0011cb61;
          }
          iVar19 = (*pcVar14)(uVar12,uVar9,p_Var8);
          bVar21 = iVar19 < 0;
          if (iVar19 != 0) goto LAB_0011cb9c;
          if (local_108 == 3) {
            iVar19 = (*pcVar15)(delta,uVar13,p_Var8,uVar9);
            bVar21 = iVar19 < 0;
            if (iVar19 != 0) goto LAB_0011cb61;
          }
          else {
            N_VScale(0x3ff0000000000000,p_Var8,uVar9);
          }
          if (lVar10 == 0) {
            N_VScale(0x3ff0000000000000,uVar9,p_Var8);
          }
          else {
            N_VProd(lVar10,uVar9,p_Var8);
          }
          local_68 = (double)N_VDotProd(p_Var8,uVar3);
          local_68 = (double)CONCAT44(uVar26,uVar25) / local_68;
          uStack_60 = 0;
          local_48._8_4_ = DAT_00122180._8_4_;
          local_48._0_8_ = (ulong)local_68 ^ (ulong)DAT_00122180;
          local_48._12_4_ = DAT_00122180._12_4_;
          N_VLinearSum(0x3ff0000000000000,uVar4,p_Var8,uVar6);
          if (lVar11 == 0) {
            N_VScale(0x3ff0000000000000,uVar6,uVar9);
          }
          else {
            N_VDiv(uVar6,lVar11,uVar9);
          }
          if (uVar17 == 2) {
            N_VScale(0x3ff0000000000000,uVar9,uVar7);
            iVar19 = (*pcVar15)(delta,uVar13,uVar7,uVar9);
            bVar21 = iVar19 < 0;
            if (iVar19 != 0) goto LAB_0011cb61;
          }
          iVar19 = (*pcVar14)(uVar12,uVar9,uVar7);
          bVar21 = iVar19 < 0;
          if (iVar19 != 0) goto LAB_0011cb9c;
          if (local_108 == 3) {
            iVar19 = (*pcVar15)(delta,uVar13,uVar7,uVar9);
            bVar21 = iVar19 < 0;
            if (iVar19 != 0) goto LAB_0011cb61;
          }
          else {
            N_VScale(0x3ff0000000000000,uVar7,uVar9);
          }
          if (lVar10 == 0) {
            N_VScale(0x3ff0000000000000,uVar9,uVar7);
          }
          else {
            N_VProd(lVar10,uVar9,uVar7);
          }
          dVar22 = (double)N_VDotProd(uVar7,uVar7);
          auVar28._0_8_ = ~-(ulong)(dVar22 == 0.0) & (ulong)dVar22;
          auVar28._8_8_ = 0;
          local_98 = auVar28 | ZEXT416((uint)(-(ulong)(dVar22 == 0.0) >> 0x20) & 0x3ff00000) << 0x20
          ;
          dVar22 = (double)N_VDotProd(uVar7,uVar6);
          dVar22 = dVar22 / (double)local_98._0_8_;
          local_98._8_4_ = (int)extraout_XMM0_Qb;
          local_98._0_8_ = dVar22;
          local_98._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
          if ((iVar18 == 1) && (piVar2[2] != 0)) {
            N_VLinearSum(local_68,p_Var5,uVar6,x);
          }
          else {
            local_88._8_8_ = local_68;
            local_88._0_8_ = 0x3ff0000000000000;
            local_b8 = x;
            local_b0 = p_Var5;
            local_a8 = uVar6;
            local_78 = dVar22;
            N_VLinearCombination(3,local_88,&local_b8);
          }
          N_VLinearSum(0x3ff0000000000000,uVar6,uVar7,uVar4);
          dVar22 = (double)N_VDotProd(uVar4,uVar4);
          local_c8 = 0.0;
          if (0.0 < dVar22) {
            local_c8 = (double)N_VDotProd(uVar4,uVar4);
            if (local_c8 < 0.0) {
              local_c8 = sqrt(local_c8);
            }
            else {
              local_c8 = SQRT(local_c8);
            }
          }
          *(double *)(piVar2 + 4) = local_c8;
          if (local_c8 <= delta) break;
          dVar24 = (double)N_VDotProd(uVar4,uVar3);
          dVar27 = dVar24 / (double)CONCAT44(uVar26,uVar25);
          dVar22 = (double)local_48._0_8_ * dVar27;
          local_88._8_4_ = SUB84(dVar22,0);
          local_88._0_8_ = (local_68 / (double)local_98._0_8_) * dVar27;
          local_88._12_4_ = (int)((ulong)dVar22 >> 0x20);
          local_78 = 1.0;
          local_b8 = p_Var5;
          local_b0 = p_Var8;
          local_a8 = uVar4;
          N_VLinearCombination(3,local_88,&local_b8);
          bVar16 = iVar18 < iVar20;
          iVar19 = (int)local_50 + iVar18;
          iVar18 = iVar18 + 1;
          uVar25 = SUB84(dVar24,0);
          uVar26 = (undefined4)((ulong)dVar24 >> 0x20);
        } while (iVar19 != 0);
      }
      if ((!bVar16) && (dVar23 <= local_c8)) {
        piVar2[2] = 0;
        *(undefined4 *)((long)S->content + 0x18) = 0x322;
        return 0x322;
      }
      if (lVar11 != 0) {
        N_VDiv(x,lVar11,x);
      }
      if (uVar17 != 2) {
LAB_0011d254:
        piVar2[2] = 0;
        iVar20 = 0x321;
        if (bVar16) {
          iVar20 = 0;
        }
        *(int *)((long)S->content + 0x18) = iVar20;
        return iVar20;
      }
      iVar20 = (*pcVar15)(delta,uVar13,x,uVar9);
      bVar21 = iVar20 < 0;
      if (iVar20 == 0) {
        N_VScale(0x3ff0000000000000,uVar9,x);
        goto LAB_0011d254;
      }
    }
LAB_0011cb61:
    piVar2[2] = 0;
    iVar18 = -0x328;
    iVar20 = 0x325;
  }
  if (bVar21) {
    iVar20 = iVar18;
  }
LAB_0011d19c:
  *(int *)((long)S->content + 0x18) = iVar20;
  return iVar20;
}

Assistant:

int SUNLinSolSolve_SPBCGS(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A,
                          N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  sunrealtype alpha, beta, omega, omega_denom, beta_num, beta_denom, r_norm, rho;
  N_Vector r_star, r, p, q, u, Ap, vtemp;
  sunbooleantype preOnLeft, preOnRight, scale_x, scale_b, converged;
  sunbooleantype* zeroguess;
  int l, l_max;
  void *A_data, *P_data;
  N_Vector sx, sb;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  sunrealtype* res_norm;
  int* nli;
  int status;

  /* local variables for fused vector operations */
  sunrealtype cv[3];
  N_Vector Xv[3];

  /* Make local shorcuts to solver variables. */
  l_max     = SPBCGS_CONTENT(S)->maxl;
  r_star    = SPBCGS_CONTENT(S)->r_star;
  r         = SPBCGS_CONTENT(S)->r;
  p         = SPBCGS_CONTENT(S)->p;
  q         = SPBCGS_CONTENT(S)->q;
  u         = SPBCGS_CONTENT(S)->u;
  Ap        = SPBCGS_CONTENT(S)->Ap;
  vtemp     = SPBCGS_CONTENT(S)->vtemp;
  sb        = SPBCGS_CONTENT(S)->s1;
  sx        = SPBCGS_CONTENT(S)->s2;
  A_data    = SPBCGS_CONTENT(S)->ATData;
  P_data    = SPBCGS_CONTENT(S)->PData;
  atimes    = SPBCGS_CONTENT(S)->ATimes;
  psolve    = SPBCGS_CONTENT(S)->Psolve;
  zeroguess = &(SPBCGS_CONTENT(S)->zeroguess);
  nli       = &(SPBCGS_CONTENT(S)->numiters);
  res_norm  = &(SPBCGS_CONTENT(S)->resnorm);

  /* Initialize counters and convergence flag */
  *nli      = 0;
  converged = SUNFALSE;

  /* set sunbooleantype flags for internal solver options */
  preOnLeft = ((PRETYPE(S) == SUN_PREC_LEFT) || (PRETYPE(S) == SUN_PREC_BOTH));
  preOnRight = ((PRETYPE(S) == SUN_PREC_RIGHT) || (PRETYPE(S) == SUN_PREC_BOTH));
  scale_x = (sx != NULL);
  scale_b = (sb != NULL);

  /* Check for unsupported use case */
  if (preOnRight && !(*zeroguess))
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_ERR_ARG_INCOMPATIBLE;
    return SUN_ERR_ARG_INCOMPATIBLE;
  }

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!(preOnLeft || preOnRight) || psolve, SUN_ERR_ARG_CORRUPT);

  /* Set r_star to initial (unscaled) residual r_0 = b - A*x_0 */

  if (*zeroguess)
  {
    N_VScale(ONE, b, r_star);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, r_star);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, r_star, r_star);
    SUNCheckLastErr();
  }

  /* Apply left preconditioner and b-scaling to r_star = r_0 */

  if (preOnLeft)
  {
    status = psolve(P_data, r_star, r, delta, SUN_PREC_LEFT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;
      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, r_star, r);
    SUNCheckLastErr();
  }

  if (scale_b)
  {
    N_VProd(sb, r, r_star);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, r, r_star);
    SUNCheckLastErr();
  }

  /* Initialize beta_denom to the dot product of r0 with r0 */

  beta_denom = N_VDotProd(r_star, r_star);
  SUNCheckLastErr();

  /* Set r_norm to L2 norm of r_star = sb P1_inv r_0, and
     return if small */

  *res_norm = r_norm = rho = SUNRsqrt(beta_denom);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                     "SUNLinSolSolve_SPBCGS", "initial-residual",
                     "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

  if (r_norm <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;
    return (LASTFLAG(S));
  }

  /* Copy r_star to r and p */

  N_VScale(ONE, r_star, r);
  SUNCheckLastErr();
  N_VScale(ONE, r_star, p);
  SUNCheckLastErr();

  /* Set x = sx x if non-zero guess */
  if (scale_x && !(*zeroguess))
  {
    N_VProd(sx, x, x);
    SUNCheckLastErr();
  }

  /* Begin main iteration loop */

  for (l = 0; l < l_max; l++)
  {
    (*nli)++;

    /* Generate Ap = A-tilde p, where A-tilde = sb P1_inv A P2_inv sx_inv */

    /*   Apply x-scaling: vtemp = sx_inv p */

    if (scale_x)
    {
      N_VDiv(p, sx, vtemp);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, p, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply right preconditioner: vtemp = P2_inv sx_inv p */

    if (preOnRight)
    {
      N_VScale(ONE, vtemp, Ap);
      SUNCheckLastErr();
      status = psolve(P_data, Ap, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }

    /*   Apply A: Ap = A P2_inv sx_inv p */

    status = atimes(A_data, vtemp, Ap);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }

    /*   Apply left preconditioner: vtemp = P1_inv A P2_inv sx_inv p */

    if (preOnLeft)
    {
      status = psolve(P_data, Ap, vtemp, delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, Ap, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply b-scaling: Ap = sb P1_inv A P2_inv sx_inv p */

    if (scale_b)
    {
      N_VProd(sb, vtemp, Ap);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, vtemp, Ap);
      SUNCheckLastErr();
    }

    /* Calculate alpha = <r,r_star>/<Ap,r_star> */

    alpha = N_VDotProd(Ap, r_star);
    SUNCheckLastErr();
    alpha = beta_denom / alpha;

    /* Update q = r - alpha*Ap = r - alpha*(sb P1_inv A P2_inv sx_inv p) */

    N_VLinearSum(ONE, r, -alpha, Ap, q);
    SUNCheckLastErr();

    /* Generate u = A-tilde q */

    /*   Apply x-scaling: vtemp = sx_inv q */

    if (scale_x)
    {
      N_VDiv(q, sx, vtemp);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, q, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply right preconditioner: vtemp = P2_inv sx_inv q */

    if (preOnRight)
    {
      N_VScale(ONE, vtemp, u);
      SUNCheckLastErr();
      status = psolve(P_data, u, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }

    /*   Apply A: u = A P2_inv sx_inv u */

    status = atimes(A_data, vtemp, u);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }

    /*   Apply left preconditioner: vtemp = P1_inv A P2_inv sx_inv p */

    if (preOnLeft)
    {
      status = psolve(P_data, u, vtemp, delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, u, vtemp);
      SUNCheckLastErr();
    }

    /*   Apply b-scaling: u = sb P1_inv A P2_inv sx_inv u */

    if (scale_b)
    {
      N_VProd(sb, vtemp, u);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, vtemp, u);
      SUNCheckLastErr();
    }

    /* Calculate omega = <u,q>/<u,u> */

    omega_denom = N_VDotProd(u, u);
    SUNCheckLastErr();
    if (omega_denom == ZERO) { omega_denom = ONE; }
    omega = N_VDotProd(u, q);
    SUNCheckLastErr();
    omega /= omega_denom;

    /* Update x = x + alpha*p + omega*q */
    if (l == 0 && *zeroguess)
    {
      N_VLinearSum(alpha, p, omega, q, x);
      SUNCheckLastErr();
    }
    else
    {
      cv[0] = ONE;
      Xv[0] = x;

      cv[1] = alpha;
      Xv[1] = p;

      cv[2] = omega;
      Xv[2] = q;

      SUNCheckCall(N_VLinearCombination(3, cv, Xv, x));
    }

    /* Update the residual r = q - omega*u */

    N_VLinearSum(ONE, q, -omega, u, r);
    SUNCheckLastErr();

    /* Set rho = norm(r) and check convergence */

    *res_norm = rho = SUNRsqrt(N_VDotProd(r, r));
    SUNCheckLastErr();

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                       "SUNLinSolSolve_SPBCGS", "iterate-residual",
                       "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

    if (rho <= delta)
    {
      converged = SUNTRUE;
      break;
    }

    /* Not yet converged, continue iteration */
    /* Update beta = <rnew,r_star> / <rold,r_start> * alpha / omega */

    beta_num = N_VDotProd(r, r_star);
    SUNCheckLastErr();
    beta = ((beta_num / beta_denom) * (alpha / omega));

    /* Update p = r + beta*(p - omega*Ap) = beta*p - beta*omega*Ap + r */
    cv[0] = beta;
    Xv[0] = p;

    cv[1] = -alpha * (beta_num / beta_denom);
    Xv[1] = Ap;

    cv[2] = ONE;
    Xv[2] = r;

    SUNCheckCall(N_VLinearCombination(3, cv, Xv, p));

    /* udpate beta_denom for next iteration */
    beta_denom = beta_num;
  }

  /* Main loop finished */

  if ((converged == SUNTRUE) || (rho < r_norm))
  {
    /* Apply the x-scaling and right preconditioner: x = P2_inv sx_inv x */

    if (scale_x)
    {
      N_VDiv(x, sx, x);
      SUNCheckLastErr();
    }
    if (preOnRight)
    {
      status = psolve(P_data, x, vtemp, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
      N_VScale(ONE, vtemp, x);
      SUNCheckLastErr();
    }

    *zeroguess = SUNFALSE;
    if (converged == SUNTRUE) { LASTFLAG(S) = SUN_SUCCESS; }
    else { LASTFLAG(S) = SUNLS_RES_REDUCED; }
    return (LASTFLAG(S));
  }
  else
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_CONV_FAIL;
    return (LASTFLAG(S));
  }
}